

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

FloatParts uint_to_float(uint64_t a,int scale,float_status *status)

{
  FloatParts FVar1;
  int iVar2;
  int local_40;
  int local_3c;
  int local_38;
  int shift;
  float_status *status_local;
  uint64_t uStack_20;
  int scale_local;
  uint64_t a_local;
  FloatParts r;
  
  uStack_20 = a;
  memset(&a_local,0,0x10);
  if (uStack_20 == 0) {
    r.frac._4_1_ = 1;
  }
  else {
    local_38 = scale;
    if (scale < -0xffff) {
      local_38 = -0x10000;
    }
    if (local_38 < 0x10000) {
      local_3c = scale;
      if (scale < -0xffff) {
        local_3c = -0x10000;
      }
      local_40 = local_3c;
    }
    else {
      local_40 = 0x10000;
    }
    r.frac._4_1_ = 2;
    if ((long)uStack_20 < 0) {
      r.frac._0_4_ = local_40 + 0x3f;
      shift64RightJamming(uStack_20,1,&stack0xffffffffffffffe0);
      a_local = uStack_20;
    }
    else {
      iVar2 = clz64(uStack_20);
      r.frac._0_4_ = (0x3e - (iVar2 + -1)) + local_40;
      a_local = uStack_20 << ((byte)(iVar2 + -1) & 0x3f);
    }
  }
  FVar1.exp = (int)r.frac;
  FVar1.frac = a_local;
  FVar1.cls = r.frac._4_1_;
  FVar1.sign = (_Bool)r.frac._5_1_;
  FVar1._14_2_ = r.frac._6_2_;
  return FVar1;
}

Assistant:

static FloatParts uint_to_float(uint64_t a, int scale, float_status *status)
{
    FloatParts r = { .sign = false };

    if (a == 0) {
        r.cls = float_class_zero;
    } else {
        scale = MIN(MAX(scale, -0x10000), 0x10000);
        r.cls = float_class_normal;
        if ((int64_t)a < 0) {
            r.exp = DECOMPOSED_BINARY_POINT + 1 + scale;
            shift64RightJamming(a, 1, &a);
            r.frac = a;
        } else {
            int shift = clz64(a) - 1;
            r.exp = DECOMPOSED_BINARY_POINT - shift + scale;
            r.frac = a << shift;
        }
    }

    return r;
}